

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void helper_booke206_tlbsx_ppc64(CPUPPCState_conflict2 *env,target_ulong address)

{
  target_ulong tVar1;
  target_ulong tVar2;
  int iVar3;
  int iVar4;
  int ways;
  uint32_t sas;
  uint32_t spid;
  hwaddr raddr;
  int j;
  int i;
  ppcmas_tlb_t *tlb;
  target_ulong address_local;
  CPUPPCState_conflict2 *env_local;
  
  _j = (ppcmas_tlb_t *)0x0;
  tVar1 = env->spr[0x276];
  tVar2 = env->spr[0x276];
  raddr._4_4_ = 0;
  tlb = (ppcmas_tlb_t *)address;
  address_local = (target_ulong)env;
  do {
    if (3 < raddr._4_4_) {
      *(ulong *)(address_local + 0x1e98) = *(ulong *)(address_local + 0x1eb8) & 0x30000000;
      *(ulong *)(address_local + 0x1ea0) = *(ulong *)(address_local + 0x1eb8) & 0xf80;
      *(ulong *)(address_local + 0x1ea8) = *(ulong *)(address_local + 0x1eb8) & 0x1f;
      *(undefined8 *)(address_local + 0x1eb0) = 0;
      *(undefined8 *)(address_local + 0x2898) = 0;
      if ((*(ulong *)(address_local + 0x1ec8) & 1) != 0) {
        *(ulong *)(address_local + 0x1ea0) = *(ulong *)(address_local + 0x1ea0) | 0x1000;
      }
      *(ulong *)(address_local + 0x1ea0) =
           *(ulong *)(address_local + 0x1ec8) & 0xffffffffffff0000 |
           *(ulong *)(address_local + 0x1ea0);
      *(ulong *)(address_local + 0x1e98) =
           (long)(*(int *)(address_local + 0xad4) << 0x10) | *(ulong *)(address_local + 0x1e98);
      *(int *)(address_local + 0xad4) = *(int *)(address_local + 0xad4) + 1;
      iVar3 = booke206_tlb_ways((CPUPPCState_conflict2 *)address_local,0);
      *(uint *)(address_local + 0xad4) = iVar3 - 1U & *(uint *)(address_local + 0xad4);
      *(ulong *)(address_local + 0x1e98) =
           (long)*(int *)(address_local + 0xad4) | *(ulong *)(address_local + 0x1e98);
      return;
    }
    iVar3 = booke206_tlb_ways((CPUPPCState_conflict2 *)address_local,raddr._4_4_);
    for (raddr._0_4_ = 0; (int)raddr < iVar3; raddr._0_4_ = (int)raddr + 1) {
      _j = booke206_get_tlbm((CPUPPCState_conflict2 *)address_local,raddr._4_4_,(target_ulong)tlb,
                             (int)raddr);
      if (((_j != (ppcmas_tlb_t *)0x0) &&
          (iVar4 = ppcmas_tlb_check((CPUPPCState_conflict2 *)address_local,_j,(hwaddr *)&sas,
                                    (target_ulong)tlb,(uint)(tVar1 >> 0x10) & 0x3fff), iVar4 == 0))
         && (((uint)tVar2 & 1) == (_j->mas1 & 0x1000) >> 0xc)) {
        booke206_tlb_to_mas((CPUPPCState_conflict2 *)address_local,_j);
        return;
      }
    }
    raddr._4_4_ = raddr._4_4_ + 1;
  } while( true );
}

Assistant:

void helper_booke206_tlbsx(CPUPPCState *env, target_ulong address)
{
    ppcmas_tlb_t *tlb = NULL;
    int i, j;
    hwaddr raddr;
    uint32_t spid, sas;

    spid = (env->spr[SPR_BOOKE_MAS6] & MAS6_SPID_MASK) >> MAS6_SPID_SHIFT;
    sas = env->spr[SPR_BOOKE_MAS6] & MAS6_SAS;

    for (i = 0; i < BOOKE206_MAX_TLBN; i++) {
        int ways = booke206_tlb_ways(env, i);

        for (j = 0; j < ways; j++) {
            tlb = booke206_get_tlbm(env, i, address, j);

            if (!tlb) {
                continue;
            }

            if (ppcmas_tlb_check(env, tlb, &raddr, address, spid)) {
                continue;
            }

            if (sas != ((tlb->mas1 & MAS1_TS) >> MAS1_TS_SHIFT)) {
                continue;
            }

            booke206_tlb_to_mas(env, tlb);
            return;
        }
    }

    /* no entry found, fill with defaults */
    env->spr[SPR_BOOKE_MAS0] = env->spr[SPR_BOOKE_MAS4] & MAS4_TLBSELD_MASK;
    env->spr[SPR_BOOKE_MAS1] = env->spr[SPR_BOOKE_MAS4] & MAS4_TSIZED_MASK;
    env->spr[SPR_BOOKE_MAS2] = env->spr[SPR_BOOKE_MAS4] & MAS4_WIMGED_MASK;
    env->spr[SPR_BOOKE_MAS3] = 0;
    env->spr[SPR_BOOKE_MAS7] = 0;

    if (env->spr[SPR_BOOKE_MAS6] & MAS6_SAS) {
        env->spr[SPR_BOOKE_MAS1] |= MAS1_TS;
    }

    env->spr[SPR_BOOKE_MAS1] |= (env->spr[SPR_BOOKE_MAS6] >> 16)
        << MAS1_TID_SHIFT;

    /* next victim logic */
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_ESEL_SHIFT;
    env->last_way++;
    env->last_way &= booke206_tlb_ways(env, 0) - 1;
    env->spr[SPR_BOOKE_MAS0] |= env->last_way << MAS0_NV_SHIFT;
}